

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O3

void diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::dequeue_values
               (vector<float,_std::allocator<float>_> *v,ReduceProxy *rp,bool skip_self)

{
  int iVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer __src;
  mapped_type *pmVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int local_50;
  int local_4c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  vector<float,_std::allocator<float>_> *local_40;
  ulong local_38;
  
  local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_48->_M_use_count = 1;
  local_48->_M_weak_count = 1;
  local_48->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0014e2c0;
  local_38 = (ulong)((long)(rp->in_link_).neighbors_.
                           super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(rp->in_link_).neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3;
  pfVar2 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pfVar3 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar6 = (uint)local_38;
  local_40 = v;
  if ((int)uVar6 < 1) {
    lVar7 = 0;
  }
  else {
    uVar8 = 0;
    lVar7 = 0;
    do {
      iVar1 = (rp->in_link_).neighbors_.
              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8].gid;
      if ((!skip_self) || ((rp->super_Proxy).gid_ != iVar1)) {
        local_50 = iVar1;
        pmVar4 = std::
                 map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                 ::operator[](&(rp->super_Proxy).incoming_,&local_50);
        lVar7 = lVar7 + ((ulong)((long)(pmVar4->buffer).
                                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(pmVar4->buffer).
                                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2);
      }
      uVar8 = uVar8 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar8);
  }
  lVar5 = (long)pfVar2 - (long)pfVar3 >> 2;
  std::vector<float,_std::allocator<float>_>::resize(local_40,lVar7 + lVar5);
  uVar6 = (uint)local_38;
  if (0 < (int)uVar6) {
    uVar8 = 0;
    do {
      iVar1 = (rp->in_link_).neighbors_.
              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8].gid;
      if ((!skip_self) || ((rp->super_Proxy).gid_ != iVar1)) {
        local_4c = iVar1;
        pmVar4 = std::
                 map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                 ::operator[](&(rp->super_Proxy).incoming_,&local_4c);
        __src = (pmVar4->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
        uVar9 = (long)(pmVar4->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)__src;
        if (3 < uVar9) {
          memmove((local_40->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start + lVar5,__src,uVar9 & 0xfffffffffffffffc);
        }
        lVar5 = lVar5 + (uVar9 >> 2);
      }
      uVar8 = uVar8 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar8);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  return;
}

Assistant:

static void     dequeue_values(std::vector<T>& v, const ReduceProxy& rp, bool skip_self = true)
    {
        auto log = get_logger();

        int k_in  = rp.in_link().size();

        log->trace("dequeue_values(): gid={}, round={}; v.size()={}", rp.gid(), rp.round(), v.size());

        if (detail::is_default< Serialization<T> >::value)
        {
            // add up sizes
            size_t sz = 0;
            size_t end = v.size();
            for (int i = 0; i < k_in; ++i)
            {
                log->trace("    incoming size from {}: {}", rp.in_link().target(i).gid, sz);
                if (skip_self && rp.in_link().target(i).gid == rp.gid()) continue;
                MemoryBuffer& in = rp.incoming(rp.in_link().target(i).gid);
                sz += in.size() / sizeof(T);
            }
            log->trace("    incoming size: {}", sz);
            v.resize(end + sz);

            for (int i = 0; i < k_in; ++i)
            {
                if (skip_self && rp.in_link().target(i).gid == rp.gid()) continue;
                MemoryBuffer& in = rp.incoming(rp.in_link().target(i).gid);
                size_t incoming_sz = in.size() / sizeof(T);
                T* bg = (T*) &in.buffer[0];
                std::copy(bg, bg + incoming_sz, &v[end]);
                end += incoming_sz;
            }
        } else
        {
            for (int i = 0; i < k_in; ++i)
            {
                if (skip_self && rp.in_link().target(i).gid == rp.gid()) continue;
                MemoryBuffer& in = rp.incoming(rp.in_link().target(i).gid);
                while(in)
                {
                    T x;
                    diy::load(in, x);
                    v.emplace_back(std::move(x));
                }
            }
        }
        log->trace("    v.size()={}", v.size());
    }